

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

ssize_t Curl_recv_plain(connectdata *conn,int num,char *buf,size_t len,CURLcode *code)

{
  int err;
  Curl_easy *data;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  char buffer [256];
  char acStack_128 [256];
  
  sVar1 = recv(conn->sock[num],buf,len,0);
  *code = CURLE_OK;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    err = *piVar2;
    if ((err == 0xb) || (err == 4)) {
      *code = CURLE_AGAIN;
    }
    else {
      data = conn->data;
      pcVar3 = Curl_strerror(err,acStack_128,0x100);
      Curl_failf(data,"Recv failure: %s",pcVar3);
      (conn->data->state).os_errno = err;
      *code = CURLE_RECV_ERROR;
    }
  }
  return sVar1;
}

Assistant:

ssize_t Curl_recv_plain(struct connectdata *conn, int num, char *buf,
                        size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t nread;
  /* Check and return data that already received and storied in internal
     intermediate buffer */
  nread = get_pre_recved(conn, num, buf, len);
  if(nread > 0) {
    *code = CURLE_OK;
    return nread;
  }

  nread = sread(sockfd, buf, len);

  *code = CURLE_OK;
  if(-1 == nread) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *code = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(conn->data, "Recv failure: %s",
            Curl_strerror(err, buffer, sizeof(buffer)));
      conn->data->state.os_errno = err;
      *code = CURLE_RECV_ERROR;
    }
  }
  return nread;
}